

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O2

optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> __thiscall
gmlc::containers::
SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>::
pop(SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
    *this)

{
  pointer puVar1;
  undefined8 extraout_RDX;
  SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
  *in_RSI;
  optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> oVar2;
  
  std::mutex::lock(&in_RSI->m_pullLock);
  checkPullandSwap(in_RSI);
  if (((in_RSI->queueEmptyFlag)._M_base._M_i & 1U) == 0) {
    puVar1 = (in_RSI->pullElements).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_pushLock).super___mutex_base._M_mutex.__align =
         (long)puVar1[-1]._M_t.
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    puVar1[-1]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
    _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
    (this->m_pushLock).super___mutex_base._M_mutex.__size[8] = '\x01';
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::pop_back(&in_RSI->pullElements);
    checkPullandSwap(in_RSI);
  }
  else {
    (this->m_pushLock).super___mutex_base._M_mutex.__size[8] = '\0';
  }
  pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->m_pullLock);
  oVar2.
  super__Optional_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
  ._8_8_ = extraout_RDX;
  oVar2.
  super__Optional_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
  ._M_payload = (_Storage<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false>
                 )this;
  return (optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>)
         oVar2.
         super__Optional_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
  ;
}

Assistant:

std::optional<X> pop()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            checkPullandSwap();
            if (queueEmptyFlag) {
                return std::nullopt;
            }
            std::optional<X> val(
                std::move(pullElements.back()));  // do it this way to
                                                  // allow moveable only
                                                  // types
            pullElements.pop_back();
            checkPullandSwap();
            return val;
        }